

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutUInt16<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *pcVar1;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *phVar2;
  ElementType_conflict val;
  reentrant_put_transaction<unsigned_short> transaction;
  unsigned_short local_6a;
  reentrant_put_transaction<unsigned_short> local_68;
  reentrant_put_transaction<unsigned_short> local_48;
  
  local_6a = 0x10;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_reentrant_push<unsigned_short&>
            (&local_48,
             (conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             i_queue,&local_6a);
  phVar2 = local_48.m_put_transaction.m_queue;
  pcVar1 = local_48.m_queue;
  local_68.m_queue = local_48.m_queue;
  local_68.m_put_transaction.m_queue = local_48.m_put_transaction.m_queue;
  local_68.m_put_transaction.m_put_data.m_control_block =
       local_48.m_put_transaction.m_put_data.m_control_block;
  local_68.m_put_transaction.m_put_data.m_user_storage =
       local_48.m_put_transaction.m_put_data.m_user_storage;
  local_48.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  local_48.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<unsigned_short>::~reentrant_put_transaction(&local_48);
  exception_checkpoint();
  __return_storage_ptr__->m_queue = pcVar1;
  (__return_storage_ptr__->m_put_transaction).m_queue = phVar2;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_68.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_68.m_put_transaction.m_put_data.m_user_storage;
  local_68.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  local_68.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<unsigned_short>::~reentrant_put_transaction(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                ElementType val         = 16;
                auto        transaction = i_queue.start_reentrant_push(val);
                exception_checkpoint();
                return std::move(transaction);
            }